

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excess_reg_delete.cpp
# Opt level: O0

void __thiscall
backend::optimization::ExcessRegDelete::optimize_arm
          (ExcessRegDelete *this,ArmCode *arm_code,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  bool bVar1;
  __type_conflict _Var2;
  pointer pFVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  type pIVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
  *__rhs;
  long in_RSI;
  LoadStoreInst *x1_2;
  LoadStoreInst *x_2;
  LabelInst *x2;
  BrInst *x1_1;
  LabelInst *x_;
  BrInst *x_1;
  Arith2Inst *x1;
  Arith2Inst *x;
  bool del;
  Inst *inst_;
  int i;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  new_inst;
  unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
  *__range2;
  vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
  *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
  *in_stack_fffffffffffffe88;
  Operand2 *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffea8;
  ConditionCode in_stack_fffffffffffffead;
  ConditionCode in_stack_fffffffffffffeae;
  ConditionCode in_stack_fffffffffffffeaf;
  Operand2 *in_stack_fffffffffffffeb0;
  long local_140;
  long local_128;
  long local_110;
  long local_f8;
  long local_e0;
  __type_conflict local_71;
  int local_68;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  local_58;
  reference local_38;
  unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *local_30;
  __normal_iterator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = in_RSI + 8;
  local_28._M_current =
       (unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
       std::
       vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
       ::begin(in_stack_fffffffffffffe78);
  local_30 = (unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
             std::
             vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
             ::end(in_stack_fffffffffffffe78);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                       (__normal_iterator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) {
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
               ::operator*(&local_28);
    local_58.
    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              *)0x1de0dc);
    pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                       ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)0x1de0e9);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::size(&pFVar3->inst);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::reserve((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)in_stack_fffffffffffffeb0,
              CONCAT17(in_stack_fffffffffffffeaf,
                       CONCAT16(in_stack_fffffffffffffeae,
                                CONCAT15(in_stack_fffffffffffffead,in_stack_fffffffffffffea8))));
    local_68 = 0;
    while( true ) {
      pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                         ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)0x1de12f
                         );
      sVar4 = std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::size(&pFVar3->inst);
      if (sVar4 <= (ulong)(long)local_68) break;
      pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                         ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)0x1de15c
                         );
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::operator[](&pFVar3->inst,(long)local_68);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                         ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                          CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      local_71 = false;
      if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        local_e0 = 0;
      }
      else {
        local_e0 = __dynamic_cast(pbVar5,&arm::Inst::typeinfo,&arm::Arith2Inst::typeinfo,0);
      }
      if (local_e0 == 0) {
        if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          local_110 = 0;
        }
        else {
          local_110 = __dynamic_cast(pbVar5,&arm::Inst::typeinfo,&arm::BrInst::typeinfo,0);
        }
        if (local_110 == 0) {
          if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          else {
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __dynamic_cast(pbVar5,&arm::Inst::typeinfo,&arm::LoadStoreInst::typeinfo,0);
          }
          in_stack_fffffffffffffe98 = pbVar7;
          in_stack_fffffffffffffea0 = pbVar5;
          if ((pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
             && (sVar4 = std::
                         vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         ::size(&local_58), in_stack_fffffffffffffea0 = pbVar5, sVar4 != 0)) {
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
            in_stack_fffffffffffffe90 =
                 (Operand2 *)
                 std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                           ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                            CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
            if (in_stack_fffffffffffffe90 == (Operand2 *)0x0) {
              __rhs = (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                       *)0x0;
            }
            else {
              __rhs = (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                       *)__dynamic_cast(in_stack_fffffffffffffe90,&arm::Inst::typeinfo,
                                        &arm::LoadStoreInst::typeinfo,0);
            }
            in_stack_fffffffffffffe88 = __rhs;
            in_stack_fffffffffffffea0 = pbVar5;
            if ((((__rhs != (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                             *)0x0) &&
                 (*(int *)((long)&(__rhs->
                                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                  ).
                                  super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                  .
                                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                  .
                                  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                  .
                                  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                  .
                                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                  ._M_u + 8) == 0x1a)) && ((int)pbVar7->_M_string_length == 0x1c))
               && (((in_stack_fffffffffffffe87 =
                          std::operator==((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                           *)in_stack_fffffffffffffe90,__rhs),
                    in_stack_fffffffffffffea0 = pbVar5, (bool)in_stack_fffffffffffffe87 &&
                    (*(char *)((long)&pbVar7->_M_string_length + 4) ==
                     *(char *)((long)&(__rhs->
                                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                      ).
                                      super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                      .
                                      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                      .
                                      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                      .
                                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                      .
                                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                      ._M_u + 0xc))) &&
                   (*(int *)&pbVar7->field_2 ==
                    *(int *)((long)&(__rhs->
                                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                    ).
                                    super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                    .
                                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                    .
                                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                    .
                                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                    .
                                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                    ._M_u + 0x10))))) {
              local_71 = true;
            }
          }
        }
        else {
          pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                             ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                              0x1de418);
          sVar4 = std::
                  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  ::size(&pFVar3->inst);
          if ((ulong)(long)local_68 < sVar4 - 1) {
            pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                               ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                                0x1de446);
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::operator[](&pFVar3->inst,(long)(local_68 + 1));
            pIVar6 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                               ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                                CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
            if (pIVar6 == (type)0x0) {
              local_128 = 0;
            }
            else {
              local_128 = __dynamic_cast(pIVar6,&arm::Inst::typeinfo,&arm::LabelInst::typeinfo,0);
            }
            if (local_128 != 0) {
              local_71 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            }
          }
          if (*(char *)(local_110 + 0xc) != '\x10') {
            pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                               ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                                0x1de517);
            sVar4 = std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::size(&pFVar3->inst);
            if ((ulong)(long)local_68 < sVar4 - 2) {
              pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::
                       operator->((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                                  0x1de545);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::operator[](&pFVar3->inst,(long)(local_68 + 1));
              pIVar6 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                                 ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                                  CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
              if (pIVar6 == (type)0x0) {
                local_140 = 0;
              }
              else {
                local_140 = __dynamic_cast(pIVar6,&arm::Inst::typeinfo,&arm::BrInst::typeinfo,0);
              }
              pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::
                       operator->((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                                  0x1de5bd);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::operator[](&pFVar3->inst,(long)(local_68 + 2));
              pIVar6 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                                 ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                                  CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
              if (pIVar6 == (type)0x0) {
                in_stack_fffffffffffffeb0 = (Operand2 *)0x0;
              }
              else {
                in_stack_fffffffffffffeb0 =
                     (Operand2 *)
                     __dynamic_cast(pIVar6,&arm::Inst::typeinfo,&arm::LabelInst::typeinfo,0);
              }
              if (((local_140 != 0) && (in_stack_fffffffffffffeb0 != (Operand2 *)0x0)) &&
                 (_Var2 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98),
                 _Var2)) {
                if (*(char *)(local_140 + 0xc) != '\x10') {
                  in_stack_fffffffffffffeae = *(ConditionCode *)(local_140 + 0xc);
                  in_stack_fffffffffffffeaf = arm::invert_cond(*(ConditionCode *)(local_110 + 0xc));
                  if (in_stack_fffffffffffffeae != in_stack_fffffffffffffeaf) goto LAB_001de84b;
                }
                in_stack_fffffffffffffead = arm::invert_cond(*(ConditionCode *)(local_110 + 0xc));
                *(ConditionCode *)(local_140 + 0xc) = in_stack_fffffffffffffead;
                local_71 = true;
              }
            }
          }
        }
      }
      else if ((*(int *)(local_e0 + 8) == 6) &&
              (bVar1 = arm::operator==((Reg *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90),
              bVar1)) {
        local_71 = true;
      }
      else if ((*(int *)(local_e0 + 8) == 6) &&
              (sVar4 = std::
                       vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ::size(&local_58), sVar4 != 0)) {
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        pIVar6 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                           ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                            CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        if (pIVar6 == (type)0x0) {
          local_f8 = 0;
        }
        else {
          local_f8 = __dynamic_cast(pIVar6,&arm::Inst::typeinfo,&arm::Arith2Inst::typeinfo,0);
        }
        if ((((local_f8 != 0) && (*(int *)(local_f8 + 8) == 6)) &&
            (*(int *)(local_e0 + 0x10) == *(int *)(local_f8 + 0x10))) &&
           ((bVar1 = arm::Operand2::operator==
                               (in_stack_fffffffffffffeb0,
                                (Operand2 *)
                                CONCAT17(in_stack_fffffffffffffeaf,
                                         CONCAT16(in_stack_fffffffffffffeae,
                                                  CONCAT15(in_stack_fffffffffffffead,
                                                           in_stack_fffffffffffffea8)))), bVar1 &&
            (*(char *)(local_e0 + 0xc) == *(char *)(local_f8 + 0xc))))) {
          local_71 = true;
        }
      }
LAB_001de84b:
      if (local_71 == false) {
        pFVar3 = std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
                           ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
                            0x1de862);
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::operator[](&pFVar3->inst,(long)local_68);
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    (value_type *)in_stack_fffffffffffffe78);
      }
      local_68 = local_68 + 1;
    }
    std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator->
              ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)0x1de8af);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::operator=((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffe90,
                (vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffe88);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::~vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)in_stack_fffffffffffffe90);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void ExcessRegDelete::optimize_arm(
    arm::ArmCode &arm_code, std::map<std::string, std::any> &extra_data_repo) {
  for (auto &f : arm_code.functions) {
    auto new_inst = std::vector<std::unique_ptr<arm::Inst>>();
    new_inst.reserve(f->inst.size());

    for (int i = 0; i < f->inst.size(); i++) {
      auto inst_ = &*f->inst[i];
      bool del = false;
      if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
        if (x->op == arm::OpCode::Mov && (x->r1 == x->r2)) {
          // Delete `mov rA, rA`
          del = true;
        } else if (x->op == arm::OpCode::Mov && new_inst.size() > 0) {
          // Delete `mov rA, rB; mov rA, rB;`
          if (auto x1 = dynamic_cast<Arith2Inst *>(&*new_inst.back())) {
            if (x1->op == arm::OpCode::Mov && x->r1 == x1->r1 &&
                x->r2 == x1->r2 && x->cond == x1->cond) {
              del = true;
            }
          }
        }
      } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
        // thether the branch is always or not, it has no effect
        if (i < f->inst.size() - 1) {
          if (auto x_ = dynamic_cast<LabelInst *>(&*f->inst[i + 1])) {
            if (x->l == x_->label) {
              // delete `b label1;` before `label1:`
              del = true;
            }
          }
        }
        if (x->cond != arm::ConditionCode::Always && i < f->inst.size() - 2) {
          // simplify `bA label1; b label2; label1:` to `b~A label2; label1:`
          auto x1 = dynamic_cast<BrInst *>(&*f->inst[i + 1]);
          auto x2 = dynamic_cast<LabelInst *>(&*f->inst[i + 2]);
          if (x1 && x2) {
            if (x->l == x2->label && (x1->cond == arm::ConditionCode::Always ||
                                      x1->cond == invert_cond(x->cond))) {
              x1->cond = invert_cond(x->cond);
              del = true;
            }
          }
        }
      } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_);
                 x && new_inst.size() >= 1) {
        // Simplify `ldr xA, memA; str xA, memA`
        if (auto x1 = dynamic_cast<LoadStoreInst *>(&*new_inst.back())) {
          if (x1->op == arm::OpCode::LdR && x->op == arm::OpCode::StR &&
              x->mem == x1->mem && x->cond == x1->cond && x->rd == x1->rd) {
            del = true;
          }
        }
      }
      //   const std::set<OpCode> shifts = {OpCode::Lsl, OpCode::Lsr,
      //   OpCode::Asr};
      //   // Simplify `shift rA, #n; ldr/str rB, [rD, rA]`
      //   if (auto r2 = std::get_if<int32_t>(&x->r2);
      //       x->cond == arm::ConditionCode::Always && r2 &&
      //       shifts.find(x->op) != shifts.end() && i < f->inst.size() - 1)
      //       {
      //     if (auto x_ = dynamic_cast<LoadStoreInst *>(&*f->inst[i + 1]))
      //     {
      //       if (auto mem = std::get_if<MemoryOperand>(&x_->mem)) {
      //         if (auto off = std::get_if<RegisterOperand>(&mem->offset))
      //         {
      //           off->shift_amount += *r2;
      //           del = true;
      //         }
      //       }
      //     }
      //   }

      if (!del) {
        new_inst.push_back(std::move(f->inst[i]));
      }
    }

    f->inst = std::move(new_inst);
  }
}